

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug * __thiscall QDebug::operator<<(QDebug *this,char *t)

{
  long lVar1;
  QDebug *pQVar2;
  char **in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffff90;
  QString *string;
  QTextStream *in_stack_ffffffffffffffb0;
  QByteArrayView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)*in_RDI,in_RDI);
  string = (QString *)&stack0xffffffffffffffd8;
  QString::fromUtf8(in_stack_ffffffffffffffe0);
  QTextStream::operator<<(in_stack_ffffffffffffffb0,string);
  QString::~QString((QString *)0x256725);
  pQVar2 = maybeSpace(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug &operator<<(const char* t) { stream->ts << QString::fromUtf8(t); return maybeSpace(); }